

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int IDASetIncrementFactor(void *ida_mem,sunrealtype dqincfac)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDASetIncrementFactor",&IDA_mem,&idals_mem);
  if (iVar1 == 0) {
    if (dqincfac <= 0.0) {
      iVar1 = -3;
      IDAProcessError(IDA_mem,-3,0x1a1,"IDASetIncrementFactor",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                      ,"dqincfac < 0.0 illegal.");
    }
    else {
      idals_mem->dqincfac = dqincfac;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int IDASetIncrementFactor(void* ida_mem, sunrealtype dqincfac)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* Check for legal dqincfac */
  if (dqincfac <= ZERO)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_NEG_DQINCFAC);
    return (IDALS_ILL_INPUT);
  }

  idals_mem->dqincfac = dqincfac;

  return (IDALS_SUCCESS);
}